

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O1

void iutest::detail::PrintBytesInObjectTo(uchar *buf,size_t size,iu_ostream *os)

{
  undefined8 in_RAX;
  ostream *poVar1;
  char cVar2;
  size_t i;
  size_t sVar3;
  byte bVar4;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-Byte object < ",0xf);
  if (size != 0 && buf != (uchar *)0x0) {
    sVar3 = 0;
    do {
      if (sVar3 == 0x20) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"... ",4);
        break;
      }
      bVar4 = buf[sVar3];
      cVar2 = (bVar4 >> 4) + 0x30;
      if (0x9f < bVar4) {
        cVar2 = (bVar4 >> 4) + 0x37;
      }
      uStack_38._0_7_ = CONCAT16(cVar2,(undefined6)uStack_38);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(char *)((long)&uStack_38 + 6),1);
      bVar4 = bVar4 & 0xf;
      cVar2 = bVar4 + 0x30;
      if (9 < bVar4) {
        cVar2 = bVar4 + 0x37;
      }
      uStack_38 = CONCAT17(cVar2,(undefined7)uStack_38);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(char *)((long)&uStack_38 + 7),1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      sVar3 = sVar3 + 1;
    } while (size != sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,">",1);
  return;
}

Assistant:

inline void PrintBytesInObjectTo(const unsigned char* buf, size_t size, iu_ostream* os)
{
IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_BEGIN()
    const size_t kMaxCount = detail::kValues::MaxPrintContainerCount;
    *os << size << "-Byte object < ";
    if( buf != IUTEST_NULLPTR && size > 0 )
    {
        for( size_t i=0; i < size; ++i )
        {
            if( i == kMaxCount )
            {
                *os << "... ";
                break;
            }
#ifdef __clang_analyzer__
            const unsigned char n = 0;  // suppress
#else
            const unsigned char n = buf[i];
#endif
            *os << ToHex((n>>4)&0xF) << ToHex(n&0xF) << " ";
        }
    }
    *os << ">";
IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_END()
}